

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::GridAxisIrregular
          (GridAxisIrregular *this,KFLOAT64 InitialXi,KFLOAT64 FinalXi,KUINT16 PointsXi,
          KUINT8 InterleafFactor,KUINT8 AxisType,KDataStream *stream)

{
  ushort uVar1;
  KDataStream *this_00;
  byte local_42;
  ushort local_40;
  unsigned_short local_3e [2];
  KUINT8 i_1;
  KUINT8 NumPadding;
  KUINT16 i;
  KUINT16 ui16TmpVal;
  KDataStream *local_30;
  KDataStream *stream_local;
  KUINT8 AxisType_local;
  KUINT8 InterleafFactor_local;
  KFLOAT64 KStack_20;
  KUINT16 PointsXi_local;
  KFLOAT64 FinalXi_local;
  KFLOAT64 InitialXi_local;
  GridAxisIrregular *this_local;
  
  local_30 = stream;
  stream_local._4_1_ = AxisType;
  stream_local._5_1_ = InterleafFactor;
  stream_local._6_2_ = PointsXi;
  KStack_20 = FinalXi;
  FinalXi_local = InitialXi;
  InitialXi_local = (KFLOAT64)this;
  GridAxisRegular::GridAxisRegular
            (&this->super_GridAxisRegular,InitialXi,FinalXi,PointsXi,InterleafFactor,AxisType,stream
            );
  (this->super_GridAxisRegular).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridAxisIrregular_00332b38;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_vXiValues);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_vui16Padding);
  this_00 = KDataStream::operator>>(local_30,(double *)&this->m_f64CoordScaleXi);
  KDataStream::operator>>(this_00,(double *)&this->m_f64CoordOffsetXi);
  local_3e[0] = 0;
  for (local_40 = 0; local_40 < (this->super_GridAxisRegular).m_ui16NumPoints;
      local_40 = local_40 + 1) {
    KDataStream::operator>>(local_30,local_3e);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (&this->m_vXiValues,local_3e);
  }
  uVar1 = (this->super_GridAxisRegular).m_ui16NumPoints;
  for (local_42 = 0; local_42 < (byte)((ulong)uVar1 % 4); local_42 = local_42 + 1) {
    KDataStream::operator>>(local_30,local_3e);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (&this->m_vui16Padding,local_3e);
  }
  return;
}

Assistant:

GridAxisIrregular::GridAxisIrregular( KFLOAT64 InitialXi, KFLOAT64 FinalXi, KUINT16 PointsXi, KUINT8 InterleafFactor,
                                      KUINT8 AxisType, KDataStream & stream ) :
    GridAxisRegular( InitialXi, FinalXi, PointsXi, InterleafFactor, AxisType, stream )
{
    stream >> m_f64CoordScaleXi
           >> m_f64CoordOffsetXi;

    KUINT16 ui16TmpVal = 0;
    for( KUINT16 i = 0; i < m_ui16NumPoints; ++i )
    {
        stream >> ui16TmpVal;
        m_vXiValues.push_back( ui16TmpVal );
    }

    // Calculate the padding that needs to be extracted. 64 bit boundary
    KUINT8 NumPadding = m_ui16NumPoints % 4;
    for( KUINT8 i = 0; i < NumPadding; ++i )
    {
        stream >> ui16TmpVal;
        m_vui16Padding.push_back( ui16TmpVal );
    }
}